

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_input_is_key_released(nk_input *i,nk_keys key)

{
  nk_key *pnVar1;
  nk_key *k;
  nk_keys key_local;
  nk_input *i_local;
  nk_bool local_4;
  
  if (i == (nk_input *)0x0) {
    local_4 = 0;
  }
  else {
    pnVar1 = (i->keyboard).keys + key;
    if (((pnVar1->down == 0) && (pnVar1->clicked != 0)) ||
       ((pnVar1->down != 0 && (1 < pnVar1->clicked)))) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_input_is_key_released(const struct nk_input *i, enum nk_keys key)
{
const struct nk_key *k;
if (!i) return nk_false;
k = &i->keyboard.keys[key];
if ((!k->down && k->clicked) || (k->down && k->clicked >= 2))
return nk_true;
return nk_false;
}